

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroup::QSequentialAnimationGroup
          (QSequentialAnimationGroup *this,QObject *parent)

{
  QAnimationGroupPrivate *dd;
  
  dd = (QAnimationGroupPrivate *)operator_new(0xe8);
  QAbstractAnimationPrivate::QAbstractAnimationPrivate((QAbstractAnimationPrivate *)dd);
  (dd->animations).d.d = (Data *)0x0;
  (dd->animations).d.ptr = (QAbstractAnimation **)0x0;
  (dd->animations).d.size = 0;
  dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)0x0;
  (dd->super_QAbstractAnimationPrivate).isGroup = true;
  (dd->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QSequentialAnimationGroupPrivate_006aeeb8;
  *(undefined4 *)&dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.q_ptr
       = 0xffffffff;
  dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.parent =
       (QObject *)0x0;
  dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.children.d.d =
       (Data *)0x0;
  *(undefined8 *)
   ((long)&dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.children.d.d
   + 4) = 0;
  *(undefined8 *)
   ((long)&dd[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.children.d.
           ptr + 4) = 0;
  QAnimationGroup::QAnimationGroup((QAnimationGroup *)this,dd,parent);
  *(undefined ***)this = &PTR_metaObject_006aedc8;
  return;
}

Assistant:

QSequentialAnimationGroup::QSequentialAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QSequentialAnimationGroupPrivate, parent)
{
}